

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_api_dump.cpp
# Opt level: O0

XrResult ApiDumpLayerXrSetSystemNotificationsML
                   (XrInstance instance,XrSystemNotificationsSetInfoML *info)

{
  undefined8 gen_dispatch_table_00;
  bool bVar1;
  pointer ppVar2;
  ostream *this;
  invalid_argument *this_00;
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_280;
  allocator local_261;
  string local_260 [39];
  allocator local_239;
  string local_238 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218 [32];
  ostringstream local_1f8 [8];
  ostringstream oss_instance;
  _Node_iterator_base<std::pair<XrInstance_T_*const,_XrGeneratedDispatchTable_*>,_false> local_78;
  _Node_iterator_base<std::pair<XrInstance_T_*const,_XrGeneratedDispatchTable_*>,_false> local_70;
  iterator map_iter;
  undefined1 local_58 [8];
  unique_lock<std::mutex> mlock;
  XrGeneratedDispatchTable *gen_dispatch_table;
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  contents;
  XrResult result;
  XrSystemNotificationsSetInfoML *info_local;
  XrInstance instance_local;
  
  contents.
  super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = XR_SUCCESS;
  info_local = (XrSystemNotificationsSetInfoML *)instance;
  std::
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::vector((vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)&gen_dispatch_table);
  mlock._M_owns = false;
  mlock._9_7_ = 0;
  std::unique_lock<std::mutex>::unique_lock
            ((unique_lock<std::mutex> *)local_58,&g_instance_dispatch_mutex);
  local_70._M_cur =
       (__node_type *)
       std::
       unordered_map<XrInstance_T_*,_XrGeneratedDispatchTable_*,_std::hash<XrInstance_T_*>,_std::equal_to<XrInstance_T_*>,_std::allocator<std::pair<XrInstance_T_*const,_XrGeneratedDispatchTable_*>_>_>
       ::find(&g_instance_dispatch_map,(key_type *)&info_local);
  local_78._M_cur =
       (__node_type *)
       std::
       unordered_map<XrInstance_T_*,_XrGeneratedDispatchTable_*,_std::hash<XrInstance_T_*>,_std::equal_to<XrInstance_T_*>,_std::allocator<std::pair<XrInstance_T_*const,_XrGeneratedDispatchTable_*>_>_>
       ::end(&g_instance_dispatch_map);
  bVar1 = std::__detail::operator==(&local_70,&local_78);
  if (bVar1) {
    instance_local._4_4_ = XR_ERROR_VALIDATION_FAILURE;
  }
  else {
    ppVar2 = std::__detail::
             _Node_iterator<std::pair<XrInstance_T_*const,_XrGeneratedDispatchTable_*>,_false,_false>
             ::operator->((_Node_iterator<std::pair<XrInstance_T_*const,_XrGeneratedDispatchTable_*>,_false,_false>
                           *)&local_70);
    mlock._8_8_ = ppVar2->second;
  }
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_58);
  if (!bVar1) {
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[9],char_const(&)[27],char_const(&)[1]>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)&gen_dispatch_table,(char (*) [9])"XrResult",
               (char (*) [27])"xrSetSystemNotificationsML",(char (*) [1])0x2ffb54);
    std::__cxx11::ostringstream::ostringstream(local_1f8);
    this = (ostream *)std::ostream::operator<<((ostream *)local_1f8,std::hex);
    std::ostream::operator<<(this,info_local);
    std::__cxx11::ostringstream::str();
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[11],char_const(&)[9],std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)&gen_dispatch_table,(char (*) [11])"XrInstance",(char (*) [9])"instance",local_218
              );
    std::__cxx11::string::~string((string *)local_218);
    gen_dispatch_table_00 = mlock._8_8_;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_238,"info",&local_239);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_260,"const XrSystemNotificationsSetInfoML*",&local_261);
    bVar1 = ApiDumpOutputXrStruct
                      ((XrGeneratedDispatchTable *)gen_dispatch_table_00,info,(string *)local_238,
                       (string *)local_260,true,
                       (vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)&gen_dispatch_table);
    std::__cxx11::string::~string(local_260);
    std::allocator<char>::~allocator((allocator<char> *)&local_261);
    std::__cxx11::string::~string(local_238);
    std::allocator<char>::~allocator((allocator<char> *)&local_239);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument(this_00,"Invalid Operation");
      __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument)
      ;
    }
    std::
    vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::vector(&local_280,
             (vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&gen_dispatch_table);
    ApiDumpLayerRecordContent(&local_280);
    std::
    vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector(&local_280);
    contents.
    super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
         (**(code **)(mlock._8_8_ + 0x9d0))(info_local,info);
    std::__cxx11::ostringstream::~ostringstream(local_1f8);
    bVar1 = false;
  }
  std::
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector((vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)&gen_dispatch_table);
  if (bVar1 == false) {
    instance_local._4_4_ =
         contents.
         super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
  }
  return instance_local._4_4_;
}

Assistant:

XRAPI_ATTR XrResult XRAPI_CALL ApiDumpLayerXrSetSystemNotificationsML(
    XrInstance instance,
    const XrSystemNotificationsSetInfoML* info) {
    XrResult result = XR_SUCCESS;
    try {
        // Generate output for this command
        std::vector<std::tuple<std::string, std::string, std::string>> contents;
        XrGeneratedDispatchTable *gen_dispatch_table = nullptr;

        {
            std::unique_lock<std::mutex> mlock(g_instance_dispatch_mutex);
            auto map_iter = g_instance_dispatch_map.find(instance);
            if (map_iter == g_instance_dispatch_map.end()) {
                return XR_ERROR_VALIDATION_FAILURE;
            }
            gen_dispatch_table = map_iter->second;
        }

        contents.emplace_back("XrResult", "xrSetSystemNotificationsML", "");
        std::ostringstream oss_instance;
        oss_instance << std::hex << reinterpret_cast<const void*>(instance);
        contents.emplace_back("XrInstance", "instance", oss_instance.str());
        if (!ApiDumpOutputXrStruct(gen_dispatch_table, info, "info", "const XrSystemNotificationsSetInfoML*", true, contents)) {
            throw std::invalid_argument("Invalid Operation");
        }
        ApiDumpLayerRecordContent(contents);

        result = gen_dispatch_table->SetSystemNotificationsML(instance, info);
    } catch (...) {
        return XR_ERROR_VALIDATION_FAILURE;
    }
    return result;
}